

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error appendAttributeValue
                    (XML_Parser parser,ENCODING *enc,XML_Bool isCdata,char *ptr,char *end,
                    STRING_POOL *pool)

{
  XML_Char XVar1;
  DTD *table;
  char *pcVar2;
  XML_Bool XVar3;
  int iVar4;
  XML_Error XVar5;
  XML_Char *pXVar6;
  NAMED *pNVar7;
  bool bVar8;
  XML_Char *textEnd;
  XML_Error result;
  XML_Char ch;
  char checkEntityDecl;
  ENTITY *entity;
  XML_Char *name;
  int n;
  int i;
  XML_Char buf [4];
  int tok;
  char *next;
  DTD *dtd;
  STRING_POOL *pool_local;
  char *end_local;
  char *ptr_local;
  XML_Bool isCdata_local;
  ENCODING *enc_local;
  XML_Parser parser_local;
  
  table = parser->m_dtd;
  end_local = ptr;
  do {
    i = (*enc->literalScanners[0])(enc,end_local,end,(char **)buf);
    switch(i) {
    case 0:
      if (enc == parser->m_encoding) {
        parser->m_eventPtr = _buf;
      }
      return XML_ERROR_INVALID_TOKEN;
    case 6:
      pXVar6 = poolAppend(pool,enc,end_local,_buf);
      if (pXVar6 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      break;
    case 9:
      iVar4 = (*enc->predefinedEntityName)
                        (enc,end_local + enc->minBytesPerChar,_buf + -(long)enc->minBytesPerChar);
      if ((char)iVar4 == '\0') {
        pXVar6 = poolStoreString(&parser->m_temp2Pool,enc,end_local + enc->minBytesPerChar,
                                 _buf + -(long)enc->minBytesPerChar);
        if (pXVar6 == (XML_Char *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        pNVar7 = lookup(parser,&table->generalEntities,pXVar6,0);
        (parser->m_temp2Pool).ptr = (parser->m_temp2Pool).start;
        if (pool == &table->pool) {
          if (table->standalone == '\0') {
            bVar8 = table->hasParamEntityRefs != '\0';
          }
          else {
            bVar8 = parser->m_openInternalEntities != (OPEN_INTERNAL_ENTITY *)0x0;
          }
          bVar8 = (bool)(bVar8 ^ 1);
        }
        else {
          bVar8 = true;
          if (table->hasParamEntityRefs != '\0') {
            bVar8 = table->standalone != '\0';
          }
        }
        if (bVar8) {
          if (pNVar7 == (NAMED *)0x0) {
            return XML_ERROR_UNDEFINED_ENTITY;
          }
          if (*(char *)((long)&pNVar7[7].name + 2) == '\0') {
            return XML_ERROR_ENTITY_DECLARED_IN_PE;
          }
        }
        else if (pNVar7 == (NAMED *)0x0) break;
        if (*(char *)&pNVar7[7].name != '\0') {
          if (enc == parser->m_encoding) {
            parser->m_eventPtr = end_local;
          }
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        }
        if (pNVar7[6].name != (KEY)0x0) {
          if (enc == parser->m_encoding) {
            parser->m_eventPtr = end_local;
          }
          return XML_ERROR_BINARY_ENTITY_REF;
        }
        if (pNVar7[1].name == (KEY)0x0) {
          if (enc == parser->m_encoding) {
            parser->m_eventPtr = end_local;
          }
          return XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF;
        }
        *(undefined1 *)&pNVar7[7].name = 1;
        XVar5 = appendAttributeValue
                          (parser,parser->m_internalEncoding,isCdata,pNVar7[1].name,
                           pNVar7[1].name + *(int *)&pNVar7[2].name,pool);
        *(undefined1 *)&pNVar7[7].name = 0;
        if (XVar5 != XML_ERROR_NONE) {
          return XVar5;
        }
      }
      else {
        if ((pool->ptr == pool->end) && (XVar3 = poolGrow(pool), XVar3 == '\0')) {
          return XML_ERROR_NO_MEMORY;
        }
        pcVar2 = pool->ptr;
        pool->ptr = pcVar2 + 1;
        *pcVar2 = (char)iVar4;
      }
      break;
    case 10:
      iVar4 = (*enc->charRefNumber)(enc,end_local);
      if (iVar4 < 0) {
        if (enc == parser->m_encoding) {
          parser->m_eventPtr = end_local;
        }
        return XML_ERROR_BAD_CHAR_REF;
      }
      if (((isCdata != '\0') || (iVar4 != 0x20)) ||
         ((pool->ptr != pool->start && (pool->ptr[-1] != ' ')))) {
        iVar4 = XmlUtf8Encode(iVar4,(char *)&n);
        for (name._4_4_ = 0; name._4_4_ < iVar4; name._4_4_ = name._4_4_ + 1) {
          if ((pool->ptr == pool->end) && (XVar3 = poolGrow(pool), XVar3 == '\0')) {
            return XML_ERROR_NO_MEMORY;
          }
          XVar1 = *(XML_Char *)((long)&n + (long)name._4_4_);
          pXVar6 = pool->ptr;
          pool->ptr = pXVar6 + 1;
          *pXVar6 = XVar1;
        }
      }
      break;
    case -4:
      return XML_ERROR_NONE;
    case -3:
      _buf = end_local + enc->minBytesPerChar;
    case 7:
    case 0x27:
      if ((isCdata != '\0') || ((pool->ptr != pool->start && (pool->ptr[-1] != ' ')))) {
        if ((pool->ptr == pool->end) && (XVar3 = poolGrow(pool), XVar3 == '\0')) {
          return XML_ERROR_NO_MEMORY;
        }
        pXVar6 = pool->ptr;
        pool->ptr = pXVar6 + 1;
        *pXVar6 = ' ';
      }
      break;
    default:
      if (enc == parser->m_encoding) {
        parser->m_eventPtr = end_local;
      }
      return XML_ERROR_UNEXPECTED_STATE;
    case -1:
      if (enc == parser->m_encoding) {
        parser->m_eventPtr = end_local;
      }
      return XML_ERROR_INVALID_TOKEN;
    }
    end_local = _buf;
  } while( true );
}

Assistant:

static enum XML_Error
appendAttributeValue(XML_Parser parser, const ENCODING *enc, XML_Bool isCdata,
                     const char *ptr, const char *end,
                     STRING_POOL *pool)
{
  DTD * const dtd = parser->m_dtd;  /* save one level of indirection */
  for (;;) {
    const char *next;
    int tok = XmlAttributeValueTok(enc, ptr, end, &next);
    switch (tok) {
    case XML_TOK_NONE:
      return XML_ERROR_NONE;
    case XML_TOK_INVALID:
      if (enc == parser->m_encoding)
        parser->m_eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (enc == parser->m_encoding)
        parser->m_eventPtr = ptr;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_CHAR_REF:
      {
        XML_Char buf[XML_ENCODE_MAX];
        int i;
        int n = XmlCharRefNumber(enc, ptr);
        if (n < 0) {
          if (enc == parser->m_encoding)
            parser->m_eventPtr = ptr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        if (!isCdata
            && n == 0x20 /* space */
            && (poolLength(pool) == 0 || poolLastChar(pool) == 0x20))
          break;
        n = XmlEncode(n, (ICHAR *)buf);
        /* The XmlEncode() functions can never return 0 here.  That
         * error return happens if the code point passed in is either
         * negative or greater than or equal to 0x110000.  The
         * XmlCharRefNumber() functions will all return a number
         * strictly less than 0x110000 or a negative value if an error
         * occurred.  The negative value is intercepted above, so
         * XmlEncode() is never passed a value it might return an
         * error for.
         */
        for (i = 0; i < n; i++) {
          if (!poolAppendChar(pool, buf[i]))
            return XML_ERROR_NO_MEMORY;
        }
      }
      break;
    case XML_TOK_DATA_CHARS:
      if (!poolAppend(pool, enc, ptr, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_TRAILING_CR:
      next = ptr + enc->minBytesPerChar;
      /* fall through */
    case XML_TOK_ATTRIBUTE_VALUE_S:
    case XML_TOK_DATA_NEWLINE:
      if (!isCdata && (poolLength(pool) == 0 || poolLastChar(pool) == 0x20))
        break;
      if (!poolAppendChar(pool, 0x20))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_ENTITY_REF:
      {
        const XML_Char *name;
        ENTITY *entity;
        char checkEntityDecl;
        XML_Char ch = (XML_Char) XmlPredefinedEntityName(enc,
                                              ptr + enc->minBytesPerChar,
                                              next - enc->minBytesPerChar);
        if (ch) {
          if (!poolAppendChar(pool, ch))
                return XML_ERROR_NO_MEMORY;
          break;
        }
        name = poolStoreString(&parser->m_temp2Pool, enc,
                               ptr + enc->minBytesPerChar,
                               next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(parser, &dtd->generalEntities, name, 0);
        poolDiscard(&parser->m_temp2Pool);
        /* First, determine if a check for an existing declaration is needed;
           if yes, check that the entity exists, and that it is internal.
        */
        if (pool == &dtd->pool)  /* are we called from prolog? */
          checkEntityDecl =
#ifdef XML_DTD
              parser->m_prologState.documentEntity &&
#endif /* XML_DTD */
              (dtd->standalone
               ? !parser->m_openInternalEntities
               : !dtd->hasParamEntityRefs);
        else /* if (pool == &parser->m_tempPool): we are called from content */
          checkEntityDecl = !dtd->hasParamEntityRefs || dtd->standalone;
        if (checkEntityDecl) {
          if (!entity)
            return XML_ERROR_UNDEFINED_ENTITY;
          else if (!entity->is_internal)
            return XML_ERROR_ENTITY_DECLARED_IN_PE;
        }
        else if (!entity) {
          /* Cannot report skipped entity here - see comments on
             parser->m_skippedEntityHandler.
          if (parser->m_skippedEntityHandler)
            parser->m_skippedEntityHandler(parser->m_handlerArg, name, 0);
          */
          /* Cannot call the default handler because this would be
             out of sync with the call to the startElementHandler.
          if ((pool == &parser->m_tempPool) && parser->m_defaultHandler)
            reportDefault(parser, enc, ptr, next);
          */
          break;
        }
        if (entity->open) {
          if (enc == parser->m_encoding) {
            /* It does not appear that this line can be executed.
             *
             * The "if (entity->open)" check catches recursive entity
             * definitions.  In order to be called with an open
             * entity, it must have gone through this code before and
             * been through the recursive call to
             * appendAttributeValue() some lines below.  That call
             * sets the local encoding ("enc") to the parser's
             * internal encoding (internal_utf8 or internal_utf16),
             * which can never be the same as the principle encoding.
             * It doesn't appear there is another code path that gets
             * here with entity->open being TRUE.
             *
             * Since it is not certain that this logic is watertight,
             * we keep the line and merely exclude it from coverage
             * tests.
             */
            parser->m_eventPtr = ptr; /* LCOV_EXCL_LINE */
          }
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        }
        if (entity->notation) {
          if (enc == parser->m_encoding)
            parser->m_eventPtr = ptr;
          return XML_ERROR_BINARY_ENTITY_REF;
        }
        if (!entity->textPtr) {
          if (enc == parser->m_encoding)
            parser->m_eventPtr = ptr;
          return XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF;
        }
        else {
          enum XML_Error result;
          const XML_Char *textEnd = entity->textPtr + entity->textLen;
          entity->open = XML_TRUE;
          result = appendAttributeValue(parser, parser->m_internalEncoding, isCdata,
                                        (char *)entity->textPtr,
                                        (char *)textEnd, pool);
          entity->open = XML_FALSE;
          if (result)
            return result;
        }
      }
      break;
    default:
      /* The only token returned by XmlAttributeValueTok() that does
       * not have an explicit case here is XML_TOK_PARTIAL_CHAR.
       * Getting that would require an entity name to contain an
       * incomplete XML character (e.g. \xE2\x82); however previous
       * tokenisers will have already recognised and rejected such
       * names before XmlAttributeValueTok() gets a look-in.  This
       * default case should be retained as a safety net, but the code
       * excluded from coverage tests.
       *
       * LCOV_EXCL_START
       */
      if (enc == parser->m_encoding)
        parser->m_eventPtr = ptr;
      return XML_ERROR_UNEXPECTED_STATE;
      /* LCOV_EXCL_STOP */
    }
    ptr = next;
  }
  /* not reached */
}